

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::log_internal::Encode32Bit
          (log_internal *this,uint64_t tag,uint32_t value,Span<char> *buf)

{
  ulong uVar1;
  anon_unknown_4 *paVar2;
  ulong uVar3;
  anon_unknown_4 *paVar4;
  void *__src;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  anon_unknown_4 *paVar8;
  undefined1 *puVar9;
  Span<char> *pSVar10;
  Span<char> *buf_00;
  undefined4 in_register_00000014;
  ulong *size;
  anon_unknown_4 *this_00;
  anon_unknown_4 *extraout_RDX;
  undefined8 *size_00;
  ulong uVar11;
  void *value_00;
  anon_unknown_4 *paVar12;
  pointer __dest;
  anon_unknown_4 *paVar13;
  undefined1 uVar14;
  anon_unknown_4 *this_01;
  
  size = (ulong *)CONCAT44(in_register_00000014,value);
  uVar11 = tag & 0xffffffff;
  paVar12 = (anon_unknown_4 *)((long)this * 8 + 5);
  __src = (void *)VarintSize((uint64_t)paVar12);
  uVar1 = (long)__src + 4;
  uVar3 = size[1];
  if (uVar3 < uVar1) {
    puVar9 = (undefined1 *)0x0;
  }
  else {
    anon_unknown_4::EncodeRawVarint(paVar12,(uint64_t)__src,(size_t)size,buf);
    uVar5 = 0;
    do {
      if (size[1] <= uVar5) {
        Encode32Bit();
        goto LAB_0024ca33;
      }
      buf = (Span<char> *)*size;
      *(char *)((long)&buf->ptr_ + uVar5) = (char)uVar11;
      uVar11 = uVar11 >> 8;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    buf = (Span<char> *)size[1];
    if (buf < (Span<char> *)0x4) {
LAB_0024ca33:
      Encode32Bit();
      paVar12 = (anon_unknown_4 *)((long)paVar12 * 8 + 2);
      pSVar10 = buf;
      sVar6 = VarintSize((uint64_t)paVar12);
      sVar7 = VarintSize((uint64_t)this_00);
      paVar13 = (anon_unknown_4 *)buf->len_;
      if (paVar13 < this_00 + sVar6 + sVar7) {
        pSVar10 = (Span<char> *)0x0;
      }
      else {
        anon_unknown_4::EncodeRawVarint(paVar12,sVar6,(size_t)buf,pSVar10);
        anon_unknown_4::EncodeRawVarint(this_00,sVar7,(size_t)buf,pSVar10);
        __dest = buf->ptr_;
        memcpy(__dest,__src,(size_t)this_00);
        pSVar10 = (Span<char> *)((anon_unknown_4 *)buf->len_ + -(long)this_00);
        if ((anon_unknown_4 *)buf->len_ < this_00) {
          EncodeBytes();
          paVar12 = (anon_unknown_4 *)((long)__dest * 8 + 2);
          buf_00 = pSVar10;
          value_00 = __src;
          sVar6 = VarintSize((uint64_t)paVar12);
          paVar13 = (anon_unknown_4 *)pSVar10->len_;
          if (extraout_RDX <= paVar13) {
            paVar13 = extraout_RDX;
          }
          sVar7 = VarintSize((uint64_t)paVar13);
          paVar2 = (anon_unknown_4 *)(sVar7 + sVar6);
          paVar4 = (anon_unknown_4 *)pSVar10->len_;
          this_01 = extraout_RDX;
          if (((paVar2 <= paVar4) &&
              (paVar8 = paVar2 + (long)extraout_RDX + -(long)paVar4,
              paVar4 <= paVar2 + (long)extraout_RDX && paVar8 != (anon_unknown_4 *)0x0)) &&
             (this_01 = extraout_RDX + -(long)paVar8, extraout_RDX < paVar8)) {
LAB_0024cba3:
            EncodeBytesTruncate();
            paVar12 = (anon_unknown_4 *)((long)paVar13 * 8 + 2);
            sVar6 = VarintSize((uint64_t)paVar12);
            if ((void *)size_00[1] < value_00) {
              value_00 = (void *)size_00[1];
            }
            sVar7 = VarintSize((uint64_t)value_00);
            if ((ulong)size_00[1] < sVar7 + sVar6) {
              size_00[1] = 0;
              uVar14 = 0;
            }
            else {
              anon_unknown_4::EncodeRawVarint(paVar12,sVar6,(size_t)size_00,buf_00);
              uVar14 = (undefined1)*size_00;
              anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)0x0,sVar7,(size_t)size_00,buf_00);
            }
            return (bool)uVar14;
          }
          if (paVar4 < paVar2 + (long)this_01) {
            buf_00 = (Span<char> *)0x0;
          }
          else {
            anon_unknown_4::EncodeRawVarint(paVar12,sVar6,(size_t)pSVar10,buf_00);
            anon_unknown_4::EncodeRawVarint(this_01,sVar7,(size_t)pSVar10,buf_00);
            paVar13 = (anon_unknown_4 *)pSVar10->ptr_;
            memcpy(paVar13,__src,(size_t)this_01);
            buf_00 = (Span<char> *)((anon_unknown_4 *)pSVar10->len_ + -(long)this_01);
            if ((anon_unknown_4 *)pSVar10->len_ < this_01) {
              EncodeBytesTruncate();
              value_00 = __src;
              goto LAB_0024cba3;
            }
            pSVar10->ptr_ = (pointer)(this_01 + (long)pSVar10->ptr_);
          }
          pSVar10->len_ = (size_type)buf_00;
          return paVar2 + (long)this_01 <= paVar4;
        }
        buf->ptr_ = (pointer)(this_00 + (long)buf->ptr_);
      }
      buf->len_ = (size_type)pSVar10;
      return this_00 + sVar6 + sVar7 <= paVar13;
    }
    *size = *size + 4;
    puVar9 = (undefined1 *)((long)&buf[-1].len_ + 4);
  }
  size[1] = (ulong)puVar9;
  return uVar1 <= uVar3;
}

Assistant:

bool Encode32Bit(uint64_t tag, uint32_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::k32Bit);
  const size_t tag_type_size = VarintSize(tag_type);
  if (tag_type_size + sizeof(value) > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  for (size_t s = 0; s < sizeof(value); s++) {
    (*buf)[s] = static_cast<char>(value & 0xff);
    value >>= 8;
  }
  buf->remove_prefix(sizeof(value));
  return true;
}